

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O2

void __thiscall banksia::ChessBoard::clearCastleRights(ChessBoard *this,int rookPos,Side rookSide)

{
  byte bVar1;
  
  if (rookPos == 0x3f) {
    if (rookSide == white) {
      bVar1 = (byte)this->CastleRight_short;
LAB_0016444a:
      this->castleRights[1] = this->castleRights[1] & ~bVar1;
      return;
    }
  }
  else if (rookPos == 7) {
    if (rookSide == black) {
      bVar1 = (byte)this->CastleRight_short;
LAB_00164459:
      this->castleRights[0] = this->castleRights[0] & ~bVar1;
      return;
    }
  }
  else if (rookPos == 0x38) {
    if (rookSide == white) {
      bVar1 = (byte)this->CastleRight_long;
      goto LAB_0016444a;
    }
  }
  else if ((rookPos == 0) && (rookSide == black)) {
    bVar1 = (byte)this->CastleRight_long;
    goto LAB_00164459;
  }
  return;
}

Assistant:

void ChessBoard::clearCastleRights(int rookPos, Side rookSide) {
    switch (rookPos) {
        case 0:
            if (rookSide == Side::black) {
                castleRights[B] &= ~CastleRight_long;
            }
            break;
        case 7:
            if (rookSide == Side::black) {
                castleRights[B] &= ~CastleRight_short;
            }
            break;
        case 56:
            if (rookSide == Side::white) {
                castleRights[W] &= ~CastleRight_long;
            }
            break;
        case 63:
            if (rookSide == Side::white) {
                castleRights[W] &= ~CastleRight_short;
            }
            break;
    }
}